

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doJSON(QPDFJob *this,QPDF *pdf,Pipeline *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  size_t sVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  const_iterator cVar7;
  Pipeline *this_00;
  _List_node_base *p_Var8;
  undefined8 this_01;
  bool bVar9;
  bool first;
  string decode_level_str;
  JSON j_params;
  JSON schema;
  string captured_json;
  JSON captured;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  bool local_1f1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  string local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  key_type local_178;
  JSON local_158;
  QPDFJob local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  QPDFLogger local_118;
  JSON local_108;
  key_type local_f8;
  key_type local_d8;
  key_type local_b8;
  key_type local_98;
  key_type local_78;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  JSON local_40;
  
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p;
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      test_json_schema == true) {
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_String,std::allocator<Pl_String>,char_const(&)[13],Pipeline*&,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length,
               (Pl_String **)&local_1e8,(allocator<Pl_String> *)&local_1c0,
               (char (*) [13])"capture json",(Pipeline **)&local_1f0,&local_138);
    local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p;
    local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length;
    local_1e8._M_string_length = 0;
    local_1e8._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  local_1f1 = true;
  this_01 = local_1f0;
  JSON::writeDictionaryOpen((Pipeline *)local_1f0,&local_1f1,0);
  paVar5 = local_1f0;
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      json_output == false) {
    paVar1 = &local_1e8.field_2;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"version","");
    JSON::makeInt((JSON *)&local_1c0,
                  (long)((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->json_version);
    JSON::writeDictionaryItem((Pipeline *)paVar5,&local_1f1,&local_1e8,(JSON *)&local_1c0,1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
    JSON::makeDictionary();
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    uVar6 = (ulong)((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->decode_level;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    if (uVar6 < 4) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1e8,0,(char *)0x0,
                 (ulong)(&DAT_00267560 + *(int *)(&DAT_00267560 + uVar6 * 4)));
    }
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"decodelevel","");
    JSON::makeString((JSON *)&local_178,&local_1e8);
    JSON::addDictionaryMember(&local_40,(string *)&local_198,(JSON *)&local_1c0);
    if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity != &local_1b0) {
      operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
    }
    paVar5 = local_1f0;
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"parameters","");
    JSON::writeDictionaryItem
              ((Pipeline *)paVar5,&local_1f1,(string *)&local_1c0,(JSON *)&local_198,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity != &local_1b0) {
      operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
    this_01 = local_198._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      this_01 = local_198._8_8_;
    }
  }
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar3 = *(size_t *)((long)&(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header + 0x20);
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"pages","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,&local_1e8);
    bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = local_1e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
  }
  if (bVar9) {
    this_01 = this;
    doJSONPages(this,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1c0._M_allocated_capacity = (size_type)&local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"pagelabels","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,(key_type *)&local_1c0);
    bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = local_1c0._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_allocated_capacity != &local_1b0) {
      operator_delete((void *)local_1c0._M_allocated_capacity,local_1b0._M_allocated_capacity + 1);
    }
  }
  if (bVar9) {
    this_01 = this;
    doJSONPageLabels(this,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_198._M_allocated_capacity = (size_type)&local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"acroform","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,(key_type *)&local_198);
    bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = local_198._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1);
    }
  }
  if (bVar9) {
    this_01 = this;
    doJSONAcroform(this,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"attachments","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,&local_178);
    bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = local_178._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._0_8_ + 1);
    }
  }
  if (bVar9) {
    doJSONAttachments((QPDFJob *)this_01,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"encrypt","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,&local_78);
    bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar9) {
    doJSONEncrypt(this,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"outlines","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,&local_98);
    bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar9) {
    doJSONOutlines(this,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  bVar9 = true;
  if (sVar3 != 0) {
    peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"objects","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar2->json_keys)._M_t,&local_b8);
    if (cVar7._M_node == &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header) {
      peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"qpdf","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(peVar2->json_keys)._M_t,&local_d8);
      bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar4 = true;
      goto LAB_001829c1;
    }
  }
  bVar4 = false;
LAB_001829c1:
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2)) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2)) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (bVar9) {
    doJSONObjects(this,(Pipeline *)local_1f0,&local_1f1,pdf);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->json_version == 1) {
    if (sVar3 == 0) {
      bVar9 = true;
    }
    else {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"objectinfo","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(peVar2->json_keys)._M_t,&local_f8);
      bVar9 = cVar7._M_node != &(peVar2->json_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar9) {
      doJSONObjectinfo(this,(Pipeline *)local_1f0,&local_1f1,pdf);
    }
  }
  JSON::writeDictionaryClose((Pipeline *)local_1f0,local_1f1,0);
  Pipeline::operator<<((Pipeline *)local_1f0,"\n");
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->test_json_schema == true) {
    json_schema(&local_148,peVar2->json_version,&peVar2->json_keys);
    local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
    local_58._M_impl._M_node._M_size = 0;
    local_58._M_impl._M_node.super__List_node_base._M_prev =
         local_58._M_impl._M_node.super__List_node_base._M_next;
    JSON::parse(&local_108,&local_138);
    local_158.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_158.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar9 = JSON::checkSchema(&local_108,&local_158,
                              (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_58);
    if (local_158.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((!bVar9) &&
       (QPDFLogger::error((((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          "QPDFJob didn\'t create JSON that complies with its own rules.\n"),
       local_58._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_58)) {
      p_Var8 = local_58._M_impl._M_node.super__List_node_base._M_next;
      do {
        QPDFLogger::getError
                  (&local_118,
                   SUB81((((this->m).
                           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                  );
        this_00 = Pipeline::operator<<
                            ((Pipeline *)
                             local_118.m.
                             super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,(string *)(p_Var8 + 1));
        Pipeline::operator<<(this_00,"\n");
        if (local_118.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        p_Var8 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var8 != (_List_node_base *)&local_58);
    }
    if (local_108.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_58);
    if (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.m.super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFJob::doJSON(QPDF& pdf, Pipeline* p)
{
    // qpdf guarantees that no new top-level keys whose names start with "x-" will be added. These
    // are reserved for users.

    std::string captured_json;
    std::shared_ptr<Pl_String> pl_str;
    if (m->test_json_schema) {
        pl_str = std::make_shared<Pl_String>("capture json", p, captured_json);
        p = pl_str.get();
    }

    bool first = true;
    JSON::writeDictionaryOpen(p, first, 0);

    if (m->json_output) {
        // Exclude version and parameters to keep the output file minimal. The JSON version is
        // inside the "qpdf" key for version 2.
    } else {
        // This version is updated every time a non-backward-compatible change is made to the JSON
        // format. Clients of the JSON are to ignore unrecognized keys, so we only update the
        // version of a key disappears or if its value changes meaning.
        JSON::writeDictionaryItem(p, first, "version", JSON::makeInt(m->json_version), 1);
        JSON j_params = JSON::makeDictionary();
        std::string decode_level_str;
        switch (m->decode_level) {
        case qpdf_dl_none:
            decode_level_str = "none";
            break;
        case qpdf_dl_generalized:
            decode_level_str = "generalized";
            break;
        case qpdf_dl_specialized:
            decode_level_str = "specialized";
            break;
        case qpdf_dl_all:
            decode_level_str = "all";
            break;
        }
        j_params.addDictionaryMember("decodelevel", JSON::makeString(decode_level_str));
        JSON::writeDictionaryItem(p, first, "parameters", j_params, 1);
    }
    bool all_keys = m->json_keys.empty();
    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.

    // We do pages and pagelabels first since they have the side effect of repairing the pages tree,
    // which could potentially impact object references in remaining items.
    if (all_keys || m->json_keys.count("pages")) {
        doJSONPages(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("pagelabels")) {
        doJSONPageLabels(p, first, pdf);
    }

    // The non-special keys are output in alphabetical order, but the order doesn't actually matter.
    if (all_keys || m->json_keys.count("acroform")) {
        doJSONAcroform(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("attachments")) {
        doJSONAttachments(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("encrypt")) {
        doJSONEncrypt(p, first, pdf);
    }
    if (all_keys || m->json_keys.count("outlines")) {
        doJSONOutlines(p, first, pdf);
    }

    // We do objects last so their information is consistent with repairing the page tree. To see
    // the original file with any page tree problems and the page tree not flattened, select
    // qpdf/objects/objectinfo without other keys.
    if (all_keys || m->json_keys.count("objects") || m->json_keys.count("qpdf")) {
        doJSONObjects(p, first, pdf);
    }
    if (m->json_version == 1) {
        // "objectinfo" is not needed for version >1 since you can tell streams from other objects
        // in "objects".
        if (all_keys || m->json_keys.count("objectinfo")) {
            doJSONObjectinfo(p, first, pdf);
        }
    }

    JSON::writeDictionaryClose(p, first, 0);
    *p << "\n";

    if (m->test_json_schema) {
        // Check against schema
        JSON schema = json_schema(m->json_version, &m->json_keys);
        std::list<std::string> errors;
        JSON captured = JSON::parse(captured_json);
        if (!captured.checkSchema(schema, errors)) {
            m->log->error("QPDFJob didn't create JSON that complies with its own rules.\n");
            for (auto const& error: errors) {
                *m->log->getError() << error << "\n";
            }
        }
    }
}